

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::DGXMLScanner::scanAttValue
          (DGXMLScanner *this,XMLAttDef *attDef,XMLCh *attrName,XMLBuffer *toFill)

{
  ReaderMgr *this_00;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  XMLBuffer *pXVar4;
  bool bVar5;
  bool bVar6;
  XMLCh XVar7;
  int iVar8;
  XMLByte *pXVar9;
  XMLCh *pXVar10;
  XMLSize_t XVar11;
  uint uVar12;
  XMLSize_t XVar13;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh quoteCh;
  XMLCh tmpBuf [9];
  XMLCh local_8c;
  bool local_89;
  undefined8 local_88;
  short local_7a;
  ulong local_78;
  XMLCh local_6a;
  ulong local_68;
  XMLBuffer *local_60;
  XMLCh *local_58;
  ulong local_50;
  XMLCh local_48 [12];
  
  if (attDef == (XMLAttDef *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (ulong)(uint)attDef->fType;
  }
  toFill->fIndex = 0;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  local_58 = attrName;
  bVar6 = ReaderMgr::skipIfQuote(this_00,&local_6a);
  if (!bVar6) {
    return false;
  }
  local_89 = true;
  if ((attDef != (XMLAttDef *)0x0) && (attDef->fExternalAttribute == true)) {
    local_89 = (int)local_50 - 8U < 0xfffffff9;
  }
  uVar1 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  local_7a = 0;
  local_68 = 0;
  bVar6 = false;
  uVar12 = 1;
  local_60 = toFill;
  do {
    local_88 = (UnexpectedEOFException *)CONCAT44(local_88._4_4_,uVar12);
    local_78 = (ulong)uVar12;
    bVar5 = bVar6;
LAB_00297723:
    do {
      bVar3 = bVar5;
      local_8c = ReaderMgr::getNextChar(this_00);
      if (local_8c == L'\0') {
        local_88 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
        UnexpectedEOFException::UnexpectedEOFException
                  (local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                   ,0xb04,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
        __cxa_throw(local_88,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
      }
      if (local_8c == local_6a) {
        uVar2 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
        bVar6 = uVar1 == uVar2;
        if (bVar6) {
          return bVar6;
        }
        if (uVar2 <= uVar1 && !bVar6) {
          XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
          return bVar6;
        }
      }
      if (local_8c == L'&') {
        iVar8 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler
                  [0xd])(this,1,&local_8c);
        bVar5 = false;
        bVar6 = bVar3;
        if (iVar8 != 1) goto LAB_00297723;
      }
      else {
        if ((local_8c & 0xfc00U) == 0xdc00) {
          if (!bVar3) {
            XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
          }
        }
        else {
          if ((local_8c & 0xfc00U) == 0xd800) {
            bVar6 = true;
            if (bVar3) {
              XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
              bVar6 = bVar3;
            }
            goto LAB_0029784a;
          }
          if (bVar3) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)local_8c]
              & 0x40) == 0) {
            XMLString::binToText
                      ((uint)(ushort)local_8c,local_48,8,0x10,
                       (this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacterInAttrValue,local_58,local_48,
                       (XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
        bVar6 = false;
      }
LAB_0029784a:
      if (local_8c == L'<') {
        XMLScanner::emitError
                  (&this->super_XMLScanner,BracketInAttrValue,local_58,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      pXVar4 = local_60;
      if ((int)local_50 == 0) {
        if (((ushort)local_8c < 0xe) && ((0x2600U >> ((ushort)local_8c & 0x1f) & 1) != 0)) {
          if (((this->super_XMLScanner).fStandalone == true) &&
             ((this->super_XMLScanner).fValidate == true && local_89 == false)) {
            XMLValidator::emitError
                      ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,local_58,
                       (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
          local_8c = L' ';
        }
        goto LAB_00297a55;
      }
      bVar5 = bVar6;
      if ((int)local_78 != 0) {
        if (((ulong)(ushort)local_8c != 0x20) &&
           (pXVar9 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable,
           -1 < (char)pXVar9[(ushort)local_8c])) goto LAB_002979d5;
        local_78 = 0;
        if (((this->super_XMLScanner).fStandalone == true) &&
           ((this->super_XMLScanner).fValidate == true && local_89 == false)) {
          if ((local_68 & 1) != 0) {
            if (local_8c == L' ') goto LAB_00297723;
            local_78 = 0;
            XVar7 = ReaderMgr::peekNextChar(this_00);
            local_78 = 0;
            if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                           [(ushort)XVar7]) goto LAB_00297723;
          }
          local_78 = 0;
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,local_58,
                     (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        goto LAB_00297723;
      }
      pXVar9 = (XMLByte *)(ulong)(ushort)local_8c;
      local_78 = 0;
    } while ((char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(long)pXVar9]
             < '\0');
    local_78 = 0;
    local_88 = (UnexpectedEOFException *)CONCAT44(local_88._4_4_,1);
    if ((local_68 & 1) != 0) {
      pXVar9 = (XMLByte *)local_60->fIndex;
      if (pXVar9 == (XMLByte *)local_60->fCapacity) {
        local_88 = (UnexpectedEOFException *)((ulong)local_88._4_4_ << 0x20);
        XMLBuffer::ensureCapacity(local_60,1);
        pXVar9 = (XMLByte *)pXVar4->fIndex;
      }
      pXVar4->fIndex = (XMLSize_t)(pXVar9 + 1);
      pXVar4->fBuffer[(long)pXVar9] = L' ';
LAB_002979d5:
      local_88 = (UnexpectedEOFException *)CONCAT44(local_88._4_4_,1);
    }
    local_68 = CONCAT71((int7)((ulong)pXVar9 >> 8),1);
LAB_00297a55:
    XVar7 = local_8c;
    XVar13 = local_60->fIndex;
    if (XVar13 == local_60->fCapacity) {
      XMLBuffer::ensureCapacity(local_60,1);
      XVar13 = local_60->fIndex;
    }
    pXVar4 = local_60;
    pXVar10 = local_60->fBuffer;
    XVar11 = XVar13 + 1;
    local_60->fIndex = XVar11;
    pXVar10[XVar13] = XVar7;
    uVar12 = (uint)local_88;
    if (local_7a != 0) {
      local_78 = CONCAT62(local_78._2_6_,local_7a);
      if (XVar11 == local_60->fCapacity) {
        XMLBuffer::ensureCapacity(local_60,1);
        XVar11 = pXVar4->fIndex;
        pXVar10 = pXVar4->fBuffer;
      }
      pXVar4->fIndex = XVar11 + 1;
      pXVar10[XVar11] = (XMLCh)local_78;
      local_7a = 0;
      uVar12 = (uint)local_88;
    }
  } while( true );
}

Assistant:

bool DGXMLScanner::scanAttValue(  const   XMLAttDef* const    attDef
                                  , const XMLCh *const attrName
                                  ,       XMLBuffer&          toFill)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                        ?attDef->getType()
                        :XMLAttDef::CData;

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr.skipIfQuote(quoteCh))
        return false;

    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr.getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr.getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr.getCurrentReaderNum())
                {
                    emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(true, nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Deal with surrogate pairs
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacterInAttrValue, attrName, tmpBuf);
                    }
                }
                gotLeadingSurrogate = false;
            }

            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            if (!escaped && (nextCh == chOpenAngle))
                emitError(XMLErrs::BracketInAttrValue, attrName);

            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of leading
            //  and trailing whitespace.
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                    {
                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                             // Can't have a standalone document declaration of "yes" if  attribute
                             // values are subject to normalisation
                             fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                        }
                        nextCh = chSpace;
                    }
                }
            }
            else
            {
                if (curState == InWhitespace)
                {
                    if ((escaped && nextCh != chSpace) || !fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                    else
                    {
                        continue;
                    }
                }
                else if (curState == InContent)
                {
                    if ((nextCh == chSpace) ||
                        (fReaderMgr.getCurrentReader()->isWhitespace(nextCh) && !escaped))
                    {
                        curState = InWhitespace;

                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                            if (!firstNonWS || (nextCh != chSpace && fReaderMgr.lookingAtSpace()))
                            {
                                 // Can't have a standalone document declaration of "yes" if  attribute
                                 // values are subject to normalisation
                                 fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                            }
                        }
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }
    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}